

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist.h
# Opt level: O3

uint32_t __thiscall spvtools::opt::BasicBlock::MergeBlockIdIfAny(BasicBlock *this)

{
  Instruction *pIVar1;
  uint32_t uVar2;
  
  pIVar1 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  if ((pIVar1 != (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_) &&
     (pIVar1 = (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_,
     (pIVar1->opcode_ & ~OpUndef) == OpLoopMerge)) {
    uVar2 = (pIVar1->has_result_id_ & 1) + 1;
    if (pIVar1->has_type_id_ == false) {
      uVar2 = (uint)pIVar1->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(pIVar1,uVar2);
    return uVar2;
  }
  return 0;
}

Assistant:

iterator_template& operator--() {
      node_ = node_->previous_node_;
      return *this;
    }